

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void singlesocket(Curl_multi *multi,Curl_easy *data)

{
  curl_hash *sh;
  int *piVar1;
  curl_socket_t s;
  connectdata *conn;
  uint uVar2;
  bool bVar3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  Curl_sh_entry *pCVar8;
  void *pvVar9;
  ulong uVar10;
  Curl_easy *pCVar11;
  curl_llist_element *pcVar12;
  int in_EDX;
  uint uVar13;
  int s_00;
  curl_socket_t local_5c;
  Curl_multi *local_58;
  curl_socket_t *local_50;
  curl_socket_t socks [5];
  
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    socks[lVar7] = -1;
  }
  uVar5 = multi_getsock(data,socks,in_EDX);
  sh = &multi->sockhash;
  local_58 = multi;
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    if ((uVar5 >> ((byte)lVar7 & 0x1f) & 0x10001) == 0) {
      uVar5 = (uint)lVar7;
      goto LAB_001315a4;
    }
    s = socks[lVar7];
    pCVar8 = sh_getentry(sh,s);
    uVar13 = uVar5 >> ((byte)lVar7 & 0x1f);
    uVar6 = uVar13 & 1;
    uVar2 = uVar6 + 2;
    if ((uVar13 >> 0x10 & 1) == 0) {
      uVar2 = uVar6;
    }
    if (pCVar8 == (Curl_sh_entry *)0x0) {
      local_5c = s;
      pCVar8 = sh_getentry(sh,s);
      if (pCVar8 == (Curl_sh_entry *)0x0) {
        pCVar8 = (Curl_sh_entry *)(*Curl_ccalloc)(1,0x18);
        if (pCVar8 == (Curl_sh_entry *)0x0) {
          return;
        }
        pCVar8->easy = data;
        pCVar8->socket = s;
        pvVar9 = Curl_hash_add(sh,&local_5c,4,pCVar8);
        if (pvVar9 == (void *)0x0) {
          (*Curl_cfree)(pCVar8);
          return;
        }
      }
LAB_0013156b:
      if (local_58->socket_cb != (curl_socket_callback)0x0) {
        (*local_58->socket_cb)(data,s,uVar2,local_58->socket_userp,pCVar8->socketp);
      }
      pCVar8->action = uVar2;
    }
    else if (pCVar8->action != uVar2) goto LAB_0013156b;
  }
  uVar5 = 5;
LAB_001315a4:
  local_50 = data->sockets;
  lVar7 = 0;
  do {
    if (data->numsocks <= lVar7) {
      memcpy(local_50,socks,(ulong)uVar5 << 2);
      data->numsocks = uVar5;
      return;
    }
    s_00 = local_50[lVar7];
    uVar10 = 0;
    do {
      if (uVar5 == uVar10) goto LAB_001315e4;
      piVar1 = socks + uVar10;
      uVar10 = uVar10 + 1;
    } while (s_00 != *piVar1);
    s_00 = -1;
LAB_001315e4:
    pCVar8 = sh_getentry(sh,s_00);
    if (pCVar8 != (Curl_sh_entry *)0x0) {
      conn = data->easy_conn;
      if (conn == (connectdata *)0x0) {
LAB_00131681:
        if (local_58->socket_cb != (curl_socket_callback)0x0) {
          (*local_58->socket_cb)(data,s_00,4,local_58->socket_userp,pCVar8->socketp);
        }
        sh_delentry(sh,s_00);
      }
      else {
        bVar3 = true;
        if ((conn->recv_pipe != (curl_llist *)0x0) && (1 < conn->recv_pipe->size)) {
          if (pCVar8->easy == data) {
            _Var4 = Curl_recvpipe_head(data,conn);
            pcVar12 = conn->recv_pipe->head;
            if (_Var4) {
              pcVar12 = pcVar12->next;
            }
            pCVar8->easy = (Curl_easy *)pcVar12->ptr;
          }
          bVar3 = false;
        }
        if ((conn->send_pipe == (curl_llist *)0x0) || (conn->send_pipe->size < 2)) {
          if (bVar3) goto LAB_00131681;
        }
        else if (pCVar8->easy == data) {
          _Var4 = Curl_sendpipe_head(data,conn);
          pcVar12 = conn->send_pipe->head;
          if (_Var4) {
            pCVar11 = (Curl_easy *)pcVar12->next->ptr;
          }
          else {
            pCVar11 = (Curl_easy *)pcVar12->ptr;
          }
          pCVar8->easy = pCVar11;
        }
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static void singlesocket(struct Curl_multi *multi,
                         struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;

  for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i=0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    int action = CURL_POLL_NONE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    if(entry) {
      /* yeps, already present so check if it has the same action set */
      if(entry->action == action)
        /* same, continue */
        continue;
    }
    else {
      /* this is a socket we didn't have before, add it! */
      entry = sh_addentry(&multi->sockhash, s, data);
      if(!entry)
        /* fatal */
        return;
    }

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       action,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = action; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i=0; i< data->numsocks; i++) {
    int j;
    s = data->sockets[i];
    for(j=0; j<num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        s = CURL_SOCKET_BAD;
        break;
      }
    }

    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* this socket has been removed. Tell the app to remove it */
      bool remove_sock_from_hash = TRUE;

      /* check if the socket to be removed serves a connection which has
         other easy-s in a pipeline. In this case the socket should not be
         removed. */
      struct connectdata *easy_conn = data->easy_conn;
      if(easy_conn) {
        if(easy_conn->recv_pipe && easy_conn->recv_pipe->size > 1) {
          /* the handle should not be removed from the pipe yet */
          remove_sock_from_hash = FALSE;

          /* Update the sockhash entry to instead point to the next in line
             for the recv_pipe, or the first (in case this particular easy
             isn't already) */
          if(entry->easy == data) {
            if(Curl_recvpipe_head(data, easy_conn))
              entry->easy = easy_conn->recv_pipe->head->next->ptr;
            else
              entry->easy = easy_conn->recv_pipe->head->ptr;
          }
        }
        if(easy_conn->send_pipe  && easy_conn->send_pipe->size > 1) {
          /* the handle should not be removed from the pipe yet */
          remove_sock_from_hash = FALSE;

          /* Update the sockhash entry to instead point to the next in line
             for the send_pipe, or the first (in case this particular easy
             isn't already) */
          if(entry->easy == data) {
            if(Curl_sendpipe_head(data, easy_conn))
              entry->easy = easy_conn->send_pipe->head->next->ptr;
            else
              entry->easy = easy_conn->send_pipe->head->ptr;
          }
        }
        /* Don't worry about overwriting recv_pipe head with send_pipe_head,
           when action will be asked on the socket (see multi_socket()), the
           head of the correct pipe will be taken according to the
           action. */
      }

      if(remove_sock_from_hash) {
        /* in this case 'entry' is always non-NULL */
        if(multi->socket_cb)
          multi->socket_cb(data,
                           s,
                           CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }
    } /* if sockhash entry existed */
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  data->numsocks = num;
}